

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O2

string * __thiscall
cfd::api::HDWalletApi::CreateExtkeyFromPathString
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type,
          ExtKeyType output_key_type,string *path)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *pCVar3;
  uint32_t uVar4;
  uint32_t version;
  string local_1b0;
  ExtPubkey pubkey;
  string errmsg;
  ExtPrivkey privkey;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  core::ExtPrivkey::ExtPrivkey(&privkey);
  core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)&pubkey,extkey);
  core::ExtPrivkey::operator=(&privkey,(ExtPrivkey *)&pubkey);
  core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&pubkey);
  bVar1 = core::ExtPrivkey::IsValid(&privkey);
  if (bVar1) {
    if (path->_M_string_length == 0) {
      core::ExtPrivkey::ToString_abi_cxx11_((string *)&pubkey,&privkey);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&pubkey);
      std::__cxx11::string::~string((string *)&pubkey);
    }
    else if (output_key_type == kExtPrivkey) {
      core::ExtPrivkey::DerivePrivkey((ExtPrivkey *)&pubkey,&privkey,path);
      core::ExtPrivkey::ToString_abi_cxx11_(&errmsg,(ExtPrivkey *)&pubkey);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&errmsg);
      std::__cxx11::string::~string((string *)&errmsg);
      core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&pubkey);
    }
    else {
      core::ExtPrivkey::DerivePubkey(&pubkey,&privkey,path);
      core::ExtPubkey::ToString_abi_cxx11_(&errmsg,&pubkey);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&errmsg);
      std::__cxx11::string::~string((string *)&errmsg);
      core::ExtPubkey::~ExtPubkey(&pubkey);
    }
    uVar2 = core::ExtPrivkey::GetVersion(&privkey);
    uVar4 = 0x4358394;
    if (net_type == kLiquidV1) {
      uVar4 = 0x488ade4;
    }
    version = uVar2;
    if (net_type == kMainnet) {
      uVar4 = 0x488ade4;
    }
  }
  else {
    core::ExtPubkey::ExtPubkey(&pubkey);
    core::ExtPubkey::ExtPubkey((ExtPubkey *)&errmsg,extkey);
    core::ExtPubkey::operator=(&pubkey,(ExtPubkey *)&errmsg);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)&errmsg);
    if (output_key_type == kExtPrivkey) {
      errmsg._M_dataplus._M_p = "cfdapi_hdwallet.cpp";
      errmsg._M_string_length._0_4_ = 0x108;
      errmsg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_8485c2;
      core::logger::warn<>
                ((CfdSourceLocation *)&errmsg,
                 "Illegal output_key_type. Cannot create privkey from pubkey.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&errmsg,"Illegal output_key_type. Cannot create privkey from pubkey.",
                 (allocator *)&local_1b0);
      core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&errmsg);
      __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (path->_M_string_length == 0) {
      core::ExtPubkey::ToString_abi_cxx11_(&errmsg,&pubkey);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&errmsg);
      std::__cxx11::string::~string((string *)&errmsg);
    }
    else {
      core::ExtPubkey::DerivePubkey((ExtPubkey *)&errmsg,&pubkey,path);
      core::ExtPubkey::ToString_abi_cxx11_(&local_1b0,(ExtPubkey *)&errmsg);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      core::ExtPubkey::~ExtPubkey((ExtPubkey *)&errmsg);
    }
    uVar2 = core::ExtPubkey::GetVersion(&pubkey);
    uVar4 = 0x43587cf;
    if (net_type == kLiquidV1) {
      uVar4 = 0x488b21e;
    }
    if (net_type == kMainnet) {
      uVar4 = 0x488b21e;
    }
    version = uVar2;
    core::ExtPubkey::~ExtPubkey(&pubkey);
  }
  if (uVar2 == uVar4) {
    core::ExtPrivkey::~ExtPrivkey(&privkey);
    return __return_storage_ptr__;
  }
  pubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdapi_hdwallet.cpp";
  pubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x118;
  pubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "CreateExtkeyFromPathString";
  core::logger::warn<unsigned_int&>
            ((CfdSourceLocation *)&pubkey,"Version unmatch. key version: {}",&version);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&pubkey,"extkey networkType unmatch.",(allocator *)&errmsg)
  ;
  core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&pubkey);
  __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::CreateExtkeyFromPathString(
    const std::string& extkey, NetType net_type, ExtKeyType output_key_type,
    const std::string& path) const {
  std::string result;
  uint32_t check_version;
  uint32_t version;

  // TODO(k-matsuzawa): child_number_listの方とロジック同じなので統合したい
  ExtPrivkey privkey;
  try {
    privkey = ExtPrivkey(extkey);
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if ((errmsg.find(kBase58Error) == std::string::npos) &&
        (errmsg.find(kKeyTypeError) == std::string::npos)) {
      throw except;
    }
  }

  if (privkey.IsValid()) {
    if (path.empty()) {
      result = privkey.ToString();
    } else if (output_key_type == ExtKeyType::kExtPrivkey) {
      result = privkey.DerivePrivkey(path).ToString();
    } else {
      result = privkey.DerivePubkey(path).ToString();
    }
    version = privkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);

  } else {
    ExtPubkey pubkey;
    try {
      pubkey = ExtPubkey(extkey);
    } catch (const CfdException& pub_except) {
      std::string errmsg(pub_except.what());
      if (errmsg.find(kBase58Error) != std::string::npos) {
        warn(CFD_LOG_SOURCE, "Illegal extkey. base58 decode error.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal extkey. base58 decode error.");
      }
      throw pub_except;
    }

    if (output_key_type == ExtKeyType::kExtPrivkey) {
      warn(
          CFD_LOG_SOURCE,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
    }
    if (path.empty()) {
      result = pubkey.ToString();
    } else {
      result = pubkey.DerivePubkey(path).ToString();
    }
    version = pubkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPubkey, net_type);
  }

  if (version != check_version) {
    warn(CFD_LOG_SOURCE, "Version unmatch. key version: {}", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return result;
}